

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

HSQUIRRELVM sq_newthread(HSQUIRRELVM friendvm,SQInteger initialstacksize)

{
  SQInteger this;
  bool bVar1;
  SQObjectPtr local_40;
  SQVM *local_30;
  SQVM *v;
  SQSharedState *ss;
  SQInteger initialstacksize_local;
  HSQUIRRELVM friendvm_local;
  
  v = (SQVM *)friendvm->_sharedstate;
  ss = (SQSharedState *)initialstacksize;
  initialstacksize_local = (SQInteger)friendvm;
  local_30 = (SQVM *)sq_vm_malloc(0x158);
  SQVM::SQVM(local_30,(SQSharedState *)v);
  bVar1 = SQVM::Init(local_30,(SQVM *)initialstacksize_local,(SQInteger)ss);
  this = initialstacksize_local;
  if (bVar1) {
    SQObjectPtr::SQObjectPtr(&local_40,local_30);
    SQVM::Push((SQVM *)this,&local_40);
    SQObjectPtr::~SQObjectPtr(&local_40);
    friendvm_local = local_30;
  }
  else {
    (**(local_30->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)();
    sq_vm_free(local_30,0x158);
    friendvm_local = (HSQUIRRELVM)0x0;
  }
  return friendvm_local;
}

Assistant:

HSQUIRRELVM sq_newthread(HSQUIRRELVM friendvm, SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    ss=_ss(friendvm);

    v= (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);

    if(v->Init(friendvm, initialstacksize)) {
        friendvm->Push(v);
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
}